

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

type __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
::operator[]<std::__cxx11::string&>
          (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  iterator __position;
  Variant VStack_48;
  
  __position = lower_bound<std::__cxx11::string>(this,k);
  if (__position._M_current !=
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        **)(this + 8)) {
    bVar1 = std::operator<(k,&(__position._M_current)->first);
    if (!bVar1) goto LAB_00252787;
  }
  Rml::Variant::Variant(&VStack_48);
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)std::
          vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
          ::_M_emplace_aux<std::__cxx11::string&,Rml::Variant>
                    ((vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
                      *)this,__position._M_current,k,&VStack_48);
  Rml::Variant::~Variant(&VStack_48);
LAB_00252787:
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }